

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O0

string * __thiscall Assimp::Ogre::OgreXmlSerializer::NextNode_abi_cxx11_(OgreXmlSerializer *this)

{
  uint uVar1;
  int iVar2;
  string local_38;
  OgreXmlSerializer *local_18;
  OgreXmlSerializer *this_local;
  
  local_18 = this;
  do {
    uVar1 = (*this->m_reader->_vptr_IIrrXMLReader[2])();
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::operator=((string *)&this->m_currentNodeName,"");
      goto LAB_0073c3b2;
    }
    iVar2 = (*this->m_reader->_vptr_IIrrXMLReader[3])();
  } while (iVar2 != 1);
  CurrentNodeName_abi_cxx11_(&local_38,this,true);
  std::__cxx11::string::~string((string *)&local_38);
LAB_0073c3b2:
  this_local = (OgreXmlSerializer *)&this->m_currentNodeName;
  return (string *)this_local;
}

Assistant:

std::string &OgreXmlSerializer::NextNode()
{
    do
    {
        if (!m_reader->read())
        {
            m_currentNodeName = "";
            return m_currentNodeName;
        }
    }
    while(m_reader->getNodeType() != irr::io::EXN_ELEMENT);

    CurrentNodeName(true);
#if (OGRE_XML_SERIALIZER_DEBUG == 1)
    ASSIMP_LOG_DEBUG"<" + m_currentNodeName + ">");
#endif
    return m_currentNodeName;
}